

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCodeAttribute.cpp
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::writeValueTo
          (TypedAttribute<Imf_2_5::TimeCode> *this,OStream *os,int version)

{
  uint uVar1;
  
  uVar1 = TimeCode::timeAndFlags(&this->_value,TV60_PACKING);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,uVar1);
  uVar1 = TimeCode::userData(&this->_value);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(os,uVar1);
  return;
}

Assistant:

void
TimeCodeAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.timeAndFlags());
    Xdr::write <StreamIO> (os, _value.userData());
}